

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_to_hex.hpp
# Opt level: O3

char * mserialize::detail::write_integer_as_hex<signed_char>(char v,char *end)

{
  char *pcVar1;
  byte bVar2;
  
  if (v == '\0') {
    end[-1] = '0';
    return end + -1;
  }
  if (v < '\x01') {
    pcVar1 = end + -1;
    do {
      *pcVar1 = "0123456789ABCDEF"[-(long)(v % '\x10')];
      bVar2 = v + 0xf;
      pcVar1 = pcVar1 + -1;
      v = (char)(((byte)(v >> 7) >> 4) + v) >> 4;
    } while (0x1e < bVar2);
    *pcVar1 = '-';
    return pcVar1;
  }
  do {
    end[-1] = "0123456789ABCDEF"[v % '\x10'];
    end = end + -1;
    bVar2 = v + 0xf;
    v = (char)(((byte)(v >> 7) >> 4) + v) >> 4;
  } while (0x1e < bVar2);
  return end;
}

Assistant:

constexpr char* write_integer_as_hex(Integer v, char* end)
{
  const char digits[] = "0123456789ABCDEF";

  if (v == 0)
  {
    *--end = '0';
  }
  else if (v > 0)
  {
    while (v != 0)
    {
      *--end = digits[v % 16];
      v = static_cast<Integer>(v / 16);
    }
  }
  else
  {
    while (v != 0)
    {
      *--end = digits[-(v % 16)];
      v = static_cast<Integer>(v / 16);
    }
    *--end = '-';
  }

  return end;
}